

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::DenseSupportVectors::Clear(DenseSupportVectors *this)

{
  uint32_t cached_has_bits;
  DenseSupportVectors *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::DenseVector>::Clear(&this->vectors_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void DenseSupportVectors::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.DenseSupportVectors)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  vectors_.Clear();
  _internal_metadata_.Clear<std::string>();
}